

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  ImVector<ImDrawChannel> *this_00;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  value_type *ppvVar6;
  int i;
  int i_00;
  value_type local_60;
  
  if ((this->_ChannelsCurrent == 0) && (this->_ChannelsCount == 1)) {
    this_00 = &this->_Channels;
    iVar1 = (this->_Channels).Size;
    if (iVar1 < channels_count) {
      ImVector<ImDrawChannel>::resize(this_00,channels_count);
    }
    this->_ChannelsCount = channels_count;
    pvVar4 = ImVector<ImDrawChannel>::operator[](this_00,0);
    (pvVar4->CmdBuffer).Size = 0;
    (pvVar4->CmdBuffer).Capacity = 0;
    (pvVar4->CmdBuffer).Data = (ImDrawCmd *)0x0;
    (pvVar4->IdxBuffer).Size = 0;
    (pvVar4->IdxBuffer).Capacity = 0;
    (pvVar4->IdxBuffer).Data = (unsigned_short *)0x0;
    for (i_00 = 1; i_00 < channels_count; i_00 = i_00 + 1) {
      pvVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      if (i_00 < iVar1) {
        ImVector<ImDrawCmd>::resize(&pvVar4->CmdBuffer,0);
        pvVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
        ImVector<unsigned_short>::resize(&pvVar4->IdxBuffer,0);
      }
      else {
        (pvVar4->IdxBuffer).Size = 0;
        (pvVar4->IdxBuffer).Capacity = 0;
        (pvVar4->IdxBuffer).Data = (unsigned_short *)0x0;
        (pvVar4->CmdBuffer).Size = 0;
        (pvVar4->CmdBuffer).Capacity = 0;
        (pvVar4->CmdBuffer).Data = (ImDrawCmd *)0x0;
      }
      pvVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      if ((pvVar4->CmdBuffer).Size == 0) {
        local_60.ElemCount = 0;
        local_60.ClipRect.x = -8192.0;
        local_60.ClipRect.y = -8192.0;
        local_60.ClipRect.z = 8192.0;
        local_60.ClipRect.w = 8192.0;
        local_60.TextureId = (ImTextureID)0x0;
        local_60.UserCallback = (ImDrawCallback)0x0;
        local_60.UserCallbackData = (void *)0x0;
        pvVar5 = ImVector<ImVec4>::back(&this->_ClipRectStack);
        uVar2 = pvVar5->x;
        uVar3 = pvVar5->y;
        local_60.ClipRect.z = pvVar5->z;
        local_60.ClipRect.w = pvVar5->w;
        local_60.ClipRect.x = (float)uVar2;
        local_60.ClipRect.y = (float)uVar3;
        ppvVar6 = ImVector<void_*>::back(&this->_TextureIdStack);
        local_60.TextureId = *ppvVar6;
        pvVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
        ImVector<ImDrawCmd>::push_back(&pvVar4->CmdBuffer,&local_60);
      }
    }
    return;
  }
  __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                ,0x114,"void ImDrawList::ChannelsSplit(int)");
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}